

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMemFromBtreeResize(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  int iVar1;
  uchar *pBuf;
  
  pMem->flags = 1;
  if ((ulong)pCur->pBt->nPage * (ulong)pCur->pBt->pageSize < (ulong)(amt + offset)) {
    iVar1 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12793,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
  }
  else {
    if (pMem->szMalloc < (int)(amt + 1)) {
      iVar1 = sqlite3VdbeMemGrow(pMem,amt + 1,0);
      if (iVar1 != 0) {
        return iVar1;
      }
      pBuf = (uchar *)pMem->z;
    }
    else {
      pBuf = (uchar *)pMem->zMalloc;
      pMem->z = (char *)pBuf;
      pMem->flags = 1;
    }
    iVar1 = accessPayload(pCur,offset,amt,pBuf,0);
    if (iVar1 == 0) {
      pMem->z[amt] = '\0';
      pMem->flags = 0x10;
      pMem->n = amt;
      iVar1 = 0;
    }
    else if (((pMem->flags & 0x2400) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
  }
  return iVar1;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemFromBtreeResize(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  int rc;
  pMem->flags = MEM_Null;
  if( sqlite3BtreeMaxRecordSize(pCur)<offset+amt ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( SQLITE_OK==(rc = sqlite3VdbeMemClearAndResize(pMem, amt+1)) ){
    rc = sqlite3BtreePayload(pCur, offset, amt, pMem->z);
    if( rc==SQLITE_OK ){
      pMem->z[amt] = 0;   /* Overrun area used when reading malformed records */
      pMem->flags = MEM_Blob;
      pMem->n = (int)amt;
    }else{
      sqlite3VdbeMemRelease(pMem);
    }
  }
  return rc;
}